

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

void __thiscall
slang::SourceManager::addLineDirective
          (SourceManager *this,SourceLocation location,size_t lineNum,string_view name,uint8_t level
          )

{
  char cVar1;
  SourceLocation location_00;
  FileInfo *pFVar2;
  path *ppVar3;
  uint8_t level_local;
  unique_lock<std::shared_mutex> lock;
  path local_e8;
  size_t lineNum_local;
  error_code ec;
  string_view name_local;
  size_t sourceLineNum;
  path linePath;
  path full;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  level_local = level;
  lineNum_local = lineNum;
  std::unique_lock<std::shared_mutex>::unique_lock(&lock,&this->mutex);
  location_00 = getFullyExpandedLocImpl<std::unique_lock<std::shared_mutex>_>(this,location,&lock);
  pFVar2 = getFileInfo<std::unique_lock<std::shared_mutex>_>
                     (this,(BufferID)(location_00._0_4_ & 0xfffffff),&lock);
  if ((pFVar2 == (FileInfo *)0x0) || (pFVar2->data == (FileData *)0x0)) goto LAB_001f634f;
  std::filesystem::__cxx11::path::path(&full);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&linePath,&name_local,auto_format);
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  if (this->disableProximatePaths == false) {
    cVar1 = std::filesystem::__cxx11::path::has_relative_path();
    if (cVar1 == '\0') goto LAB_001f62a8;
    std::filesystem::current_path_abi_cxx11_((error_code *)&sourceLineNum);
    std::filesystem::__cxx11::path::lexically_proximate(&local_e8);
    std::filesystem::__cxx11::path::operator=(&full,&local_e8);
    std::filesystem::__cxx11::path::~path(&local_e8);
    ppVar3 = (path *)&sourceLineNum;
  }
  else {
LAB_001f62a8:
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_e8,&pFVar2->data->name,auto_format);
    ppVar3 = (path *)std::filesystem::__cxx11::path::replace_filename(&local_e8);
    std::filesystem::__cxx11::path::operator=(&full,ppVar3);
    ppVar3 = &local_e8;
  }
  std::filesystem::__cxx11::path::~path(ppVar3);
  sourceLineNum = getRawLineNumber<std::unique_lock<std::shared_mutex>_>(this,location_00,&lock);
  std::__cxx11::string::string((string *)&local_e8,&full._M_pathname);
  std::
  vector<slang::SourceManager::LineDirectiveInfo,std::allocator<slang::SourceManager::LineDirectiveInfo>>
  ::emplace_back<std::__cxx11::string,unsigned_long&,unsigned_long&,unsigned_char&>
            ((vector<slang::SourceManager::LineDirectiveInfo,std::allocator<slang::SourceManager::LineDirectiveInfo>>
              *)&pFVar2->lineDirectives,&local_e8._M_pathname,&sourceLineNum,&lineNum_local,
             &level_local);
  std::__cxx11::string::~string((string *)&local_e8);
  std::filesystem::__cxx11::path::~path(&linePath);
  std::filesystem::__cxx11::path::~path(&full);
LAB_001f634f:
  std::unique_lock<std::shared_mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void SourceManager::addLineDirective(SourceLocation location, size_t lineNum, std::string_view name,
                                     uint8_t level) {
    std::unique_lock<std::shared_mutex> lock(mutex);
    SourceLocation fileLocation = getFullyExpandedLocImpl(location, lock);
    FileInfo* info = getFileInfo(fileLocation.buffer(), lock);
    if (!info || !info->data)
        return;

    fs::path full;
    fs::path linePath = name;
    std::error_code ec;
    if (!disableProximatePaths && linePath.has_relative_path())
        full = linePath.lexically_proximate(fs::current_path(ec));
    else
        full = fs::path(info->data->name).replace_filename(linePath);

    size_t sourceLineNum = getRawLineNumber(fileLocation, lock);
    info->lineDirectives.emplace_back(std::string(getU8Str(full)), sourceLineNum, lineNum, level);
}